

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

int64_t yactfr::internal::anon_unknown_0::readFlSIntBe57At7(uint8_t *buf)

{
  ulong local_18;
  uint64_t res;
  uint8_t *buf_local;
  
  local_18 = CONCAT71(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(*buf,buf[1]),buf[2]),
                                                          buf[3]),buf[4]),buf[5]),buf[6]),buf[7]) &
             0x1ffffffffffffff;
  if (local_18 >> 0x38 != 0) {
    local_18 = local_18 | 0xfe00000000000000;
  }
  return local_18;
}

Assistant:

std::int64_t readFlSIntBe57At7(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[6];
    res <<= 8;
    res |= buf[7];
    res &= UINT64_C(0x1ffffffffffffff);

    if (res >> 56) {
        res |= UINT64_C(0xfe00000000000000);
    }

    return static_cast<std::int64_t>(res);
}